

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_criticalsection::test_method(util_criticalsection *this)

{
  long lVar1;
  iterator pvVar2;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  check_type cVar4;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  assertion_result local_c0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  RecursiveMutex cs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> lockTest;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cs.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  cs.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  cs.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  cs.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  cs.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&criticalblock5.super_unique_lock,
             &cs,"cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
             ,0x7d,false);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock5.super_unique_lock);
  pvVar3 = &DAT_00000001;
  pvVar2 = (iterator)0x84;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&lockTest,&cs,"cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
             ,0x84,true);
  if (lockTest.super_unique_lock._M_owns == true) {
    local_98 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_90 = "";
    local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = pvVar3;
    msg.m_begin = pvVar2;
    file.m_end = (iterator)0x86;
    file.m_begin = (iterator)&local_98;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a8,msg);
    local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x1;
    local_c0.m_message.px = (element_type *)0x0;
    local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_d0 = "true";
    local_c8 = "";
    criticalblock5.super_unique_lock._M_owns = false;
    criticalblock5.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
    local_e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_d8 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_c0,(lazy_ostream *)&criticalblock5,1,0,WARN,_cVar4,(size_t)&local_e0,0x86);
  }
  else {
    local_f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_e8 = "";
    local_100 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar3;
    msg_00.m_begin = pvVar2;
    file_00.m_end = (iterator)0x8a;
    file_00.m_begin = (iterator)&local_f0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
               msg_00);
    local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
    local_c0.m_message.px = (element_type *)0x0;
    local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    criticalblock5.super_unique_lock._M_owns = false;
    criticalblock5.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113bfa8;
    boost::test_tools::tt_detail::report_assertion
              (&local_c0,(lazy_ostream *)&criticalblock5,1,1,WARN,0xc68988,
               (size_t)&stack0xfffffffffffffef0,0x8a);
  }
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&lockTest.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_criticalsection)
{
    RecursiveMutex cs;

    do {
        LOCK(cs);
        break;

        BOOST_ERROR("break was swallowed!");
    } while(0);

    do {
        TRY_LOCK(cs, lockTest);
        if (lockTest) {
            BOOST_CHECK(true); // Needed to suppress "Test case [...] did not check any assertions"
            break;
        }

        BOOST_ERROR("break was swallowed!");
    } while(0);
}